

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_TestShell::
TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_TestShell
          (TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_TestShell *this)

{
  TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_TestShell_0040f628
  ;
  return;
}

Assistant:

TEST(TestMemoryAccountant, countAllocationsPerSizeMultipleAllocations)
{
    accountant.alloc(4);
    accountant.alloc(4);
    accountant.alloc(8);
    LONGS_EQUAL(2, accountant.totalAllocationsOfSize(4));
    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(8));
    LONGS_EQUAL(0, accountant.totalAllocationsOfSize(10));
    LONGS_EQUAL(3, accountant.totalAllocations());
}